

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpec::TagPattern::~TagPattern(TagPattern *this)

{
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__TagPattern_001655e8;
  std::__cxx11::string::~string((string *)&this->m_tag);
  return;
}

Assistant:

TestSpec::TagPattern::~TagPattern() {}